

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IexMathFpu.cpp
# Opt level: O1

void Iex_3_2::setFpExceptionHandler(FpExceptionHandler handler)

{
  sigaction action;
  sigaction local_a8;
  
  if ((anonymous_namespace)::fpeHandler == (FpExceptionHandler)0x0) {
    sigemptyset(&local_a8.sa_mask);
    local_a8.sa_flags = 0x40000004;
    local_a8.__sigaction_handler.sa_handler = catchSigFpe;
    local_a8.sa_restorer = (_func_5327 *)0x0;
    sigaction(8,&local_a8,(sigaction *)0x0);
  }
  (anonymous_namespace)::fpeHandler = handler;
  return;
}

Assistant:

void
setFpExceptionHandler (FpExceptionHandler handler)
{
    if (fpeHandler == 0)
    {
        struct sigaction action;
        sigemptyset (&action.sa_mask);
        action.sa_flags     = SA_SIGINFO | SA_NOMASK;
        action.sa_sigaction = (void (*) (int, siginfo_t*, void*)) catchSigFpe;
        action.sa_restorer  = 0;

        sigaction (SIGFPE, &action, 0);
    }

    fpeHandler = handler;
}